

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O0

void printTo<int,char,String>(FILE *fp,String *fmtstr,int *args,char *args_1,String *args_2)

{
  char *pcVar1;
  String local_50;
  String *local_30;
  String *args_local_2;
  char *args_local_1;
  int *args_local;
  String *fmtstr_local;
  FILE *fp_local;
  
  local_30 = args_2;
  args_local_2 = (String *)args_1;
  args_local_1 = (char *)args;
  args_local = (int *)fmtstr;
  fmtstr_local = (String *)fp;
  format<int,char,String>(&local_50,fmtstr,args,args_1,args_2);
  pcVar1 = String::c_str(&local_50);
  fprintf((FILE *)fp,"%s",pcVar1);
  String::~String(&local_50);
  return;
}

Assistant:

void printTo (FILE* fp, const String& fmtstr, const argtypes&... args)
{
	fprintf (fp, "%s", format (fmtstr, args...).c_str());
}